

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O3

int ReconstructIntra4(VP8EncIterator *it,int16_t *levels,uint8_t *src,uint8_t *yuv_out,int mode)

{
  ushort uVar1;
  VP8Encoder *enc;
  uint8_t *puVar2;
  int iVar3;
  uint uVar4;
  int16_t tmp [16];
  int16_t local_58 [20];
  
  enc = it->enc_;
  uVar1 = VP8I4ModeOffsets[mode];
  puVar2 = it->yuv_p_;
  uVar4 = *(byte *)it->mb_ >> 5 & 3;
  (*VP8FTransform)(src,puVar2 + uVar1,local_58);
  if (it->do_trellis_ == 0) {
    iVar3 = (*VP8EncQuantizeBlock)(local_58,levels,&enc->dqm_[uVar4].y1_);
  }
  else {
    iVar3 = TrellisQuantizeBlock
                      (enc,local_58,levels,it->left_nz_[it->i4_ >> 2] + it->top_nz_[it->i4_ & 3],3,
                       &enc->dqm_[uVar4].y1_,enc->dqm_[uVar4].lambda_trellis_i4_);
  }
  (*VP8ITransform)(puVar2 + uVar1,local_58,yuv_out,0);
  return iVar3;
}

Assistant:

static int ReconstructIntra4(VP8EncIterator* const it,
                             int16_t levels[16],
                             const uint8_t* const src,
                             uint8_t* const yuv_out,
                             int mode) {
  const VP8Encoder* const enc = it->enc_;
  const uint8_t* const ref = it->yuv_p_ + VP8I4ModeOffsets[mode];
  const VP8SegmentInfo* const dqm = &enc->dqm_[it->mb_->segment_];
  int nz = 0;
  int16_t tmp[16];

  VP8FTransform(src, ref, tmp);
  if (DO_TRELLIS_I4 && it->do_trellis_) {
    const int x = it->i4_ & 3, y = it->i4_ >> 2;
    const int ctx = it->top_nz_[x] + it->left_nz_[y];
    nz = TrellisQuantizeBlock(enc, tmp, levels, ctx, TYPE_I4_AC, &dqm->y1_,
                              dqm->lambda_trellis_i4_);
  } else {
    nz = VP8EncQuantizeBlock(tmp, levels, &dqm->y1_);
  }
  VP8ITransform(ref, tmp, yuv_out, 0);
  return nz;
}